

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateStrings
          (ParseFunctionGenerator *this,Formatter *format,FieldDescriptor *field,bool check_utf8)

{
  int iVar1;
  long lVar2;
  byte bVar3;
  Utf8CheckMode UVar4;
  FileOptions_OptimizeMode FVar5;
  char *pcVar6;
  string field_name;
  string parser_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_b0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  if (this->options_->opensource_runtime == true) {
LAB_002b5bf2:
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    local_e0.field_2._M_local_buf[0] = '\0';
    local_e0._M_string_length = 0;
    std::__cxx11::string::_M_replace((ulong)&local_e0,0,(char *)0x0,0x3f96ef);
LAB_002b5c0d:
    local_100._M_dataplus._M_p = "_internal_";
LAB_002b5ccb:
    if ((~(byte)field[1] & 0x60) == 0) {
      if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
        local_60.piece_data_ = (char *)FieldDescriptor::TypeOnceInit;
        local_90.piece_data_ = (char *)field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_60,
                   (FieldDescriptor **)&local_90);
      }
      local_b0._M_dataplus._M_p = "add";
      if ((byte)field[2] - 0xd < 0xfffffffc) {
        local_b0._M_dataplus._M_p = "mutable";
      }
    }
    else {
      local_b0._M_dataplus._M_p = "mutable";
    }
    Formatter::operator()
              (format,
               "auto str = $msg$$1$$2$_$name$();\nptr = ::$proto_ns$::internal::Inline$3$(str, ptr, ctx);\n"
               ,(char **)&local_100,(char **)&local_b0,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
  }
  else {
    iVar1 = *(int *)(*(long *)(field + 0x38) + 0x48);
    if ((((~(byte)field[1] & 0x60) == 0) ||
        (FVar5 = GetOptimizeFor(*(FileDescriptor **)(field + 0x10),this->options_,(bool *)0x0),
        FVar5 == FileOptions_OptimizeMode_LITE_RUNTIME)) ||
       (*(long *)(*(long *)(field + 0x40) + 8) != 0)) {
LAB_002b5c4d:
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      local_e0._M_string_length = 0;
      local_e0.field_2._M_local_buf[0] = '\0';
      if (iVar1 == 2) {
        std::__cxx11::string::_M_replace((ulong)&local_e0,0,(char *)0x0,0x3f970d);
      }
      else {
        if (iVar1 == 1) {
          std::__cxx11::string::_M_replace((ulong)&local_e0,0,(char *)0x0,0x3f9702);
          goto LAB_002b5c0d;
        }
        if (iVar1 == 0) goto LAB_002b5bf2;
      }
      local_100._M_dataplus._M_p = "";
      goto LAB_002b5ccb;
    }
    lVar2 = *(long *)(field + 0x28);
    bVar3 = 1;
    if (lVar2 != 0 && ((byte)field[1] & 0x10) != 0) {
      if (*(int *)(lVar2 + 4) != 1) goto LAB_002b5c4d;
      bVar3 = (*(byte *)(*(long *)(lVar2 + 0x20) + 1) & 2) >> 1;
    }
    if ((iVar1 != 0) || (bVar3 == 0)) goto LAB_002b5c4d;
    GenerateArenaString(this,format,field);
  }
  if (!check_utf8) {
    return;
  }
  UVar4 = GetUtf8CheckMode(field,this->options_);
  if (UVar4 == kNone) {
    return;
  }
  if (UVar4 == kVerify) {
    pcVar6 = "#ifndef NDEBUG\n";
LAB_002b5d91:
    Formatter::operator()<>(format,pcVar6);
  }
  else if (UVar4 == kStrict) {
    pcVar6 = "CHK_(";
    goto LAB_002b5d91;
  }
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = '\0';
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_replace((ulong)&local_100,0,(char *)0x0,0x40b55f);
  FVar5 = GetOptimizeFor(*(FileDescriptor **)(field + 0x10),this->options_,(bool *)0x0);
  if (FVar5 != FileOptions_OptimizeMode_LITE_RUNTIME) {
    local_e0._M_dataplus._M_p = "\"";
    local_e0._M_string_length = 1;
    local_60.piece_data_ = *(char **)(*(long *)(field + 8) + 0x20);
    local_60.piece_size_ = *(size_t *)(*(long *)(field + 8) + 0x28);
    local_90.piece_data_ = "\"";
    local_90.piece_size_ = 1;
    StrCat_abi_cxx11_(&local_b0,(protobuf *)&local_e0,&local_60,&local_90,
                      (AlphaNum *)local_60.piece_data_);
    std::__cxx11::string::operator=((string *)&local_100,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  Formatter::operator()(format,"::$proto_ns$::internal::VerifyUTF8(str, $1$)",&local_100);
  if (UVar4 == kVerify) {
    pcVar6 = ";\n#endif  // !NDEBUG\n";
  }
  else {
    if (UVar4 != kStrict) goto LAB_002b5e82;
    pcVar6 = ");\n";
  }
  Formatter::operator()<>(format,pcVar6);
LAB_002b5e82:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateStrings(Formatter& format,
                                             const FieldDescriptor* field,
                                             bool check_utf8) {
  FieldOptions::CType ctype = FieldOptions::STRING;
  if (!options_.opensource_runtime) {
    // Open source doesn't support other ctypes;
    ctype = field->options().ctype();
  }
  if (!field->is_repeated() && !options_.opensource_runtime &&
      GetOptimizeFor(field->file(), options_) != FileOptions::LITE_RUNTIME &&
      // For now only use arena string for strings with empty defaults.
      field->default_value_string().empty() &&
      !field->real_containing_oneof() && ctype == FieldOptions::STRING) {
    GenerateArenaString(format, field);
  } else {
    std::string parser_name;
    switch (ctype) {
      case FieldOptions::STRING:
        parser_name = "GreedyStringParser";
        break;
      case FieldOptions::CORD:
        parser_name = "CordParser";
        break;
      case FieldOptions::STRING_PIECE:
        parser_name = "StringPieceParser";
        break;
    }
    format(
        "auto str = $msg$$1$$2$_$name$();\n"
        "ptr = ::$proto_ns$::internal::Inline$3$(str, ptr, ctx);\n",
        HasInternalAccessors(ctype) ? "_internal_" : "",
        field->is_repeated() && !field->is_packable() ? "add" : "mutable",
        parser_name);
  }
  if (!check_utf8) return;  // return if this is a bytes field
  auto level = GetUtf8CheckMode(field, options_);
  switch (level) {
    case Utf8CheckMode::kNone:
      return;
    case Utf8CheckMode::kVerify:
      format("#ifndef NDEBUG\n");
      break;
    case Utf8CheckMode::kStrict:
      format("CHK_(");
      break;
  }
  std::string field_name;
  field_name = "nullptr";
  if (HasDescriptorMethods(field->file(), options_)) {
    field_name = StrCat("\"", field->full_name(), "\"");
  }
  format("::$proto_ns$::internal::VerifyUTF8(str, $1$)", field_name);
  switch (level) {
    case Utf8CheckMode::kNone:
      return;
    case Utf8CheckMode::kVerify:
      format(
          ";\n"
          "#endif  // !NDEBUG\n");
      break;
    case Utf8CheckMode::kStrict:
      format(");\n");
      break;
  }
}